

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  value_type *in_RSI;
  BlockID *in_RDI;
  vector<diy::BlockID,_std::allocator<diy::BlockID>_> *unaff_retaddr;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffc8;
  BinaryBuffer *in_stack_ffffffffffffffd0;
  undefined1 local_20 [8];
  long local_18;
  value_type *__x;
  
  load<unsigned_long>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  __x = in_RSI;
  memset(local_20,0,8);
  std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::resize
            (unaff_retaddr,(size_type)in_RDI,__x);
  if (local_18 != 0) {
    std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::operator[]
              ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__x,0);
    load<diy::BlockID>((BinaryBuffer *)in_RSI,in_RDI,0x15af06);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }